

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall ValueSymbol::~ValueSymbol(ValueSymbol *this)

{
  (this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol._vptr_SleighSymbol =
       (_func_int **)&PTR__ValueSymbol_003ff8b0;
  if (&this->patval->super_PatternExpression != (PatternExpression *)0x0) {
    PatternExpression::release(&this->patval->super_PatternExpression);
  }
  SleighSymbol::~SleighSymbol((SleighSymbol *)this);
  return;
}

Assistant:

ValueSymbol::~ValueSymbol(void)

{
  if (patval != (PatternValue *)0)
    PatternExpression::release(patval);
}